

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O0

ostream * operator<<(ostream *os,BitString *o)

{
  ulong uVar1;
  const_reference pvVar2;
  size_type sVar3;
  ostream *poVar4;
  void *this;
  string local_1e0 [36];
  int local_1bc;
  char local_1b5;
  ulong local_1a8;
  size_t pos;
  ostringstream osTmp;
  uchar *pData;
  unsigned_long linelength;
  BitString *o_local;
  ostream *os_local;
  
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&o->value,0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pos);
  local_1a8 = 0;
  while( true ) {
    uVar1 = local_1a8;
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&o->value);
    if (sVar3 <= uVar1) break;
    if ((local_1a8 != 0) && (local_1a8 % 0x50 == 0)) {
      std::ostream::operator<<(&pos,std::endl<char,std::char_traits<char>>);
    }
    local_1b5 = (char)std::setfill<char>('0');
    poVar4 = std::operator<<(&pos,local_1b5);
    local_1bc = (int)std::setw(2);
    poVar4 = std::operator<<(poVar4,(_Setw)local_1bc);
    this = (void *)std::ostream::operator<<(poVar4,std::hex);
    std::ostream::operator<<(this,(ushort)pvVar2[local_1a8]);
    local_1a8 = local_1a8 + 1;
  }
  std::__cxx11::ostringstream::str();
  std::operator<<(os,local_1e0);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pos);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const BitString& o)
	{
		const unsigned long linelength = 80;
		const unsigned char* pData = &o.value[0];
		std::ostringstream osTmp;

		for (size_t pos = 0; pos < o.value.size(); ++pos)
		{
            if (pos > 0 && (pos % linelength) == 0)
                osTmp << std::endl;

            // This is done byte by byte
			osTmp << std::setfill('0') << std::setw(2) << std::hex << (unsigned short)pData[pos];
		}

        os << osTmp.str();
		return os;
	}